

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_PointerTuple.cpp
# Opt level: O1

string * __thiscall
Type_PointerTuple::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,Type_PointerTuple *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"(",1);
  if (this->_m_pred != (TypeCluster *)0x0) {
    TypeCluster::SoftPrint_abi_cxx11_(&local_1c0,this->_m_pred);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"aI=",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",oI=",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string Type_PointerTuple::SoftPrint() const
{
    stringstream ss;
    ss <<"(";
    if(_m_pred != 0)
    {
        ss << _m_pred->SoftPrint();
    }
    ss << "aI=" << _m_aI << ",oI="<< _m_oI << ")";
    return(ss.str());
}